

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::sessionT11Fixture::createSession
          (sessionT11Fixture *this,int heartBtInt,int startDay,int endDay)

{
  string *senderCompID;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *beginString;
  _func_int **pp_Var2;
  Session *this_00;
  string local_750;
  undefined1 local_730 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  char local_710 [16];
  _Alloc_hider local_700;
  size_type local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0;
  size_t local_6e0;
  int local_6d8;
  int local_6d0;
  int local_6cc;
  undefined1 local_6c8 [16];
  string local_6b8;
  _Alloc_hider local_698;
  size_type local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  size_t local_678;
  int local_670;
  ulong local_668;
  long *local_660;
  long local_658;
  long local_650 [2];
  string local_640;
  TimeRange sessionTime;
  long local_618;
  long local_610 [6];
  SessionID sessionID;
  DataDictionaryProvider provider;
  
  if (this->object != (Session *)0x0) {
    (**(code **)(*(long *)this->object + 8))();
  }
  _sessionTime = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sessionTime,"FIXT.1.1","");
  beginString = (string *)
                &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00325880;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  std::__cxx11::string::_M_construct<char*>
            ((string *)beginString,_sessionTime,local_618 + (long)_sessionTime);
  provider.m_applicationDictionaries._M_t._M_impl._0_8_ =
       &provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
       0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00326268;
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  local_6cc = startDay;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"TW","");
  senderCompID = (string *)(local_730 + 0x10);
  local_730._0_8_ = &PTR__FieldBase_00325880;
  local_730._8_4_ = 0x31;
  local_720._M_allocated_capacity = (size_type)local_710;
  local_6d0 = endDay;
  std::__cxx11::string::_M_construct<char*>
            ((string *)senderCompID,local_750._M_dataplus._M_p,
             local_750._M_dataplus._M_p + local_750._M_string_length);
  local_6f8 = 0;
  local_6f0._M_local_buf[0] = '\0';
  local_6e0 = 0;
  local_6d8 = 0;
  local_730._0_8_ = &PTR__FieldBase_00325c20;
  local_700._M_p = (pointer)&local_6f0;
  local_660 = local_650;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"ISLD","");
  local_6c8._0_8_ = &PTR__FieldBase_00325880;
  local_6c8._8_4_ = 0x38;
  local_6b8._M_dataplus._M_p = local_6c8 + 0x20;
  local_668 = (ulong)(uint)heartBtInt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_6c8 + 0x10),local_660,local_658 + (long)local_660);
  local_698._M_p = local_6c8 + 0x40;
  local_690 = 0;
  local_688._M_local_buf[0] = '\0';
  local_678 = 0;
  local_670 = 0;
  local_6c8._0_8_ = &PTR__FieldBase_00326498;
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"");
  FIX::SessionID::SessionID
            (&sessionID,beginString,senderCompID,(string *)(local_6c8 + 0x10),&local_640);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_6c8);
  paVar1 = &local_750.field_2;
  if (local_660 != local_650) {
    operator_delete(local_660,local_650[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_730);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != paVar1) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  if (_sessionTime != local_610) {
    operator_delete(_sessionTime,local_610[0] + 1);
  }
  FIX::TimeRange::TimeRange
            (&sessionTime,&(this->super_TestCallback).startTime,&(this->super_TestCallback).endTime,
             local_6cc,local_6d0);
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  local_730._0_8_ = senderCompID;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"../spec/FIXT11.xml","");
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)local_730);
  if ((string *)local_730._0_8_ != senderCompID) {
    operator_delete((void *)local_730._0_8_,(ulong)(local_720._M_allocated_capacity + 1));
  }
  pp_Var2 = (_func_int **)(local_6c8 + 0x10);
  local_6c8._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"7","");
  local_730._0_8_ = &PTR__FieldBase_00325880;
  local_730._8_4_ = 0x468;
  local_720._M_allocated_capacity = (size_type)local_710;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_730 + 0x10),local_6c8._0_8_,
             (undefined1 *)(local_6c8._0_8_ + CONCAT44(local_6c8._12_4_,local_6c8._8_4_)));
  local_6f8 = 0;
  local_6f0._M_local_buf[0] = '\0';
  local_6e0 = 0;
  local_6d8 = 0;
  local_730._0_8_ = &PTR__FieldBase_00325800;
  local_750._M_dataplus._M_p = (pointer)paVar1;
  local_700._M_p = (pointer)&local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"../spec/FIX50.xml","");
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)local_730,&local_750);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != paVar1) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_730);
  if ((_func_int **)local_6c8._0_8_ != pp_Var2) {
    operator_delete((void *)local_6c8._0_8_,(ulong)(local_6b8._M_dataplus._M_p + 1));
  }
  local_6c8._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"4","");
  local_730._0_8_ = &PTR__FieldBase_00325880;
  local_730._8_4_ = 0x468;
  local_720._M_allocated_capacity = (size_type)local_710;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_730 + 0x10),local_6c8._0_8_,
             (undefined1 *)(local_6c8._0_8_ + CONCAT44(local_6c8._12_4_,local_6c8._8_4_)));
  local_6f8 = 0;
  local_6f0._M_local_buf[0] = '\0';
  local_6e0 = 0;
  local_6d8 = 0;
  local_730._0_8_ = &PTR__FieldBase_00325800;
  local_750._M_dataplus._M_p = (pointer)paVar1;
  local_700._M_p = (pointer)&local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"../spec/FIX42.xml","");
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)local_730,&local_750);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != paVar1) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_730);
  if ((_func_int **)local_6c8._0_8_ != pp_Var2) {
    operator_delete((void *)local_6c8._0_8_,(ulong)(local_6b8._M_dataplus._M_p + 1));
  }
  local_6c8._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"2","");
  local_730._0_8_ = &PTR__FieldBase_00325880;
  local_730._8_4_ = 0x468;
  local_720._M_allocated_capacity = (size_type)local_710;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_730 + 0x10),local_6c8._0_8_,
             (undefined1 *)(local_6c8._0_8_ + CONCAT44(local_6c8._12_4_,local_6c8._8_4_)));
  local_6f8 = 0;
  local_6f0._M_local_buf[0] = '\0';
  local_6e0 = 0;
  local_6d8 = 0;
  local_730._0_8_ = &PTR__FieldBase_00325800;
  local_750._M_dataplus._M_p = (pointer)paVar1;
  local_700._M_p = (pointer)&local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"../spec/FIX40.xml","");
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)local_730,&local_750);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != paVar1) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_730);
  if ((_func_int **)local_6c8._0_8_ != pp_Var2) {
    operator_delete((void *)local_6c8._0_8_,(ulong)(local_6b8._M_dataplus._M_p + 1));
  }
  this_00 = (Session *)operator_new(0x848);
  FIX::Session::Session
            (this_00,&(this->super_TestCallback).super_NullApplication.super_Application,
             (MessageStoreFactory *)&this->factory,&sessionID,&provider,&sessionTime,(int)local_668,
             (LogFactory *)0x0);
  this->object = this_00;
  local_750._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"FIX.5.0","");
  local_6c8._0_8_ = &PTR__FieldBase_00325880;
  local_6c8._8_4_ = 8;
  local_6b8._M_dataplus._M_p = local_6c8 + 0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_6c8 + 0x10),local_750._M_dataplus._M_p,
             local_750._M_dataplus._M_p + local_750._M_string_length);
  local_698._M_p = local_6c8 + 0x40;
  local_690 = 0;
  local_688._M_local_buf[0] = '\0';
  local_678 = 0;
  local_670 = 0;
  local_6c8._0_8_ = &PTR__FieldBase_00326268;
  FIX::Message::toApplVerID((ApplVerID *)local_730,(BeginString *)local_6c8);
  std::__cxx11::string::_M_assign((string *)(this_00 + 0x1f8));
  FIX::FieldBase::~FieldBase((FieldBase *)local_730);
  FIX::FieldBase::~FieldBase((FieldBase *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != paVar1) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  FIX::Session::setResponder(this->object,(Responder *)this);
  FIX::DataDictionary::~DataDictionary(&provider.emptyDataDictionary);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree(&provider.m_applicationDictionaries._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
               *)&provider);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_frozenString._M_dataplus._M_p != &sessionID.m_frozenString.field_2) {
    operator_delete(sessionID.m_frozenString._M_dataplus._M_p,
                    sessionID.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_sessionQualifier._M_dataplus._M_p != &sessionID.m_sessionQualifier.field_2) {
    operator_delete(sessionID.m_sessionQualifier._M_dataplus._M_p,
                    sessionID.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID);
  return;
}

Assistant:

virtual void createSession( int heartBtInt, int startDay = -1 , int endDay = -1 )
  {
    if( object )
      delete object;

    SessionID sessionID( BeginString( "FIXT.1.1" ),
                         SenderCompID( "TW" ), TargetCompID( "ISLD" ) );
    TimeRange sessionTime( startTime, endTime, startDay, endDay );

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIXT11.xml" );
    provider.addApplicationDataDictionary( ApplVerID(ApplVerID_FIX50), "../spec/FIX50.xml" );
    provider.addApplicationDataDictionary( ApplVerID(ApplVerID_FIX42), "../spec/FIX42.xml" );
    provider.addApplicationDataDictionary( ApplVerID(ApplVerID_FIX40), "../spec/FIX40.xml" );

    object = new Session( *this, factory, sessionID, provider,
                           sessionTime, heartBtInt, 0 );
    object->setSenderDefaultApplVerID( FIX::Message::toApplVerID(BeginString("FIX.5.0")) );
    object->setResponder( this );
  }